

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O2

bool ShaderParserParseTextures
               (string *base_path,string *prev_line,string *line,uint32_t current_char,
               uint32_t line_number,FErrorReport *report_error,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *watches,vector<Texture,_std::allocator<Texture>_> *textures)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  Texture texture;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  string path;
  string full_path;
  string uniform_type;
  
  std::__cxx11::string::substr((ulong)&path,(ulong)prev_line);
  uVar2 = 0xffffffffffffffff;
  uVar3 = 0xffffffff;
  for (uVar4 = 0; path._M_string_length != uVar4; uVar4 = uVar4 + 1) {
    if (path._M_dataplus._M_p[uVar4] == '(') {
      uVar3 = uVar4 & 0xffffffff;
    }
    if (path._M_dataplus._M_p[uVar4] == ')') {
      uVar2 = uVar4;
    }
    uVar2 = uVar2 & 0xffffffff;
  }
  if ((int)uVar3 < (int)uVar2) {
    std::__cxx11::string::substr((ulong)&texture,(ulong)&path);
    std::__cxx11::string::operator=((string *)&path,(string *)&texture);
    std::__cxx11::string::~string((string *)&texture);
    SplitString(&uniform_tokens,line,' ');
    if ((long)uniform_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)uniform_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      std::__cxx11::string::string
                ((string *)&uniform_type,
                 (string *)
                 (uniform_tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      bVar1 = std::operator!=(&uniform_type,"sampler2D");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texture,"@path syntax is only supported on sampler2D uniform types",
                   (allocator<char> *)&full_path);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
        ::operator()(report_error,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture,
                     line_number);
        std::__cxx11::string::~string((string *)&texture);
        bVar1 = false;
      }
      else {
        stbi__vertically_flip_on_load_global = 1;
        texture.Data = (uchar *)0x0;
        texture.Binding._M_dataplus._M_p = (pointer)&texture.Binding.field_2;
        texture.Binding._M_string_length = 0;
        texture.Binding.field_2._M_local_buf[0] = '\0';
        texture.Id = 0;
        std::operator+(&bStack_108,base_path,'/');
        std::operator+(&full_path,&bStack_108,&path);
        std::__cxx11::string::~string((string *)&bStack_108);
        texture.Data = stbi_load(full_path._M_dataplus._M_p,&texture.Width,&texture.Height,
                                 &texture.Channels,4);
        bVar1 = texture.Data != (stbi_uc *)0x0;
        if (texture.Data == (stbi_uc *)0x0) {
          std::operator+(&bStack_108,"Failed to load texture at path ",&path);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
          ::operator()(report_error,&bStack_108,line_number);
          std::__cxx11::string::~string((string *)&bStack_108);
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)&bStack_108,
                     (ulong)(uniform_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2));
          std::__cxx11::string::operator=((string *)&texture.Binding,(string *)&bStack_108);
          std::__cxx11::string::~string((string *)&bStack_108);
          std::vector<Texture,_std::allocator<Texture>_>::push_back(textures,&texture);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(watches,&full_path);
        }
        std::__cxx11::string::~string((string *)&full_path);
        std::__cxx11::string::~string((string *)&texture.Binding);
      }
      std::__cxx11::string::~string((string *)&uniform_type);
    }
    else {
      bVar1 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&uniform_tokens);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture,
                   "Path format should be @path(path): ",&path);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
    ::operator()(report_error,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture,
                 line_number);
    std::__cxx11::string::~string((string *)&texture);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&path);
  return bVar1;
}

Assistant:

bool ShaderParserParseTextures(const std::string& base_path, const std::string& prev_line, const std::string& line, uint32_t current_char, uint32_t line_number, FErrorReport report_error, std::vector<std::string>& watches, std::vector<Texture>& textures) {
    int last_parenthesis_index = -1;
    int first_parenthesis_index = -1;

    std::string path = prev_line.substr(current_char + 5, std::string::npos);

    for (int i = 0; i < path.size(); ++i) {
        if (path[i] == '(') first_parenthesis_index = i;
        if (path[i] == ')') last_parenthesis_index = i;
    }

    if (last_parenthesis_index <= first_parenthesis_index) {
        report_error("Path format should be @path(path): " + path, line_number);
        return false;
    }

    path = path.substr(first_parenthesis_index + 1, last_parenthesis_index - 1);

    std::vector<std::string> uniform_tokens = SplitString(line,  ' ');
    if (uniform_tokens.size() != 3) {
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type != "sampler2D") {
        report_error("@path syntax is only supported on sampler2D uniform types", line_number);
        return false;
    }

    stbi_set_flip_vertically_on_load(true);

    Texture texture;
    std::string full_path = base_path + PATH_DELIMITER + path;
    texture.Data = stbi_load(full_path.c_str(), &texture.Width, &texture.Height, &texture.Channels, 4);

    if (!texture.Data) {
        report_error("Failed to load texture at path " + path, line_number);
        return false;
    }
    texture.Binding = uniform_tokens[2].substr(0, uniform_tokens[2].length() - 1);

    textures.push_back(texture);
    watches.push_back(full_path);

    return true;
}